

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int io_close(lua_State *L)

{
  int iVar1;
  lua_State *L_local;
  
  iVar1 = lua_type(L,1);
  if (iVar1 == -1) {
    lua_rawgeti(L,-0x2711,2);
  }
  tofile(L);
  iVar1 = aux_close(L);
  return iVar1;
}

Assistant:

static int io_close(lua_State*L){
if(lua_isnone(L,1))
lua_rawgeti(L,(-10001),2);
tofile(L);
return aux_close(L);
}